

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

size_t wwHiZeroBits(word *a,size_t n)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  size_t i;
  long local_20;
  size_t local_8;
  
  local_20 = in_RSI;
  do {
    lVar1 = local_20 + -1;
    bVar2 = false;
    if (local_20 != 0) {
      bVar2 = *(long *)(in_RDI + lVar1 * 8) == 0;
    }
    local_20 = lVar1;
  } while (bVar2);
  if (lVar1 == -1) {
    local_8 = in_RSI << 6;
  }
  else {
    local_8 = u64CLZ(0x186f39);
    local_8 = ((in_RSI - lVar1) + -1) * 0x40 + local_8;
  }
  return local_8;
}

Assistant:

size_t wwHiZeroBits(const word a[], size_t n)
{
	register size_t i = n;
	ASSERT(wwIsValid(a, n));
	// поиск старшего ненулевого машинного слова
	while (i-- && a[i] == 0);
	// нулевое слово?
	if (i == SIZE_MAX)
		return n * B_PER_W;
	// ... ненулевое
	return (n - i - 1) * B_PER_W + wordCLZ(a[i]);
}